

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xer_encoder.c
# Opt level: O1

asn_enc_rval_t *
xer_encode(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,
          xer_encoder_flags_e xer_flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  asn_enc_rval_t local_48;
  
  if (sptr != (void *)0x0 && td != (asn_TYPE_descriptor_t *)0x0) {
    __s = td->xml_tag;
    sVar2 = strlen(__s);
    iVar1 = (*cb)("<",1,app_key);
    if (((-1 < iVar1) && (iVar1 = (*cb)(__s,sVar2,app_key), -1 < iVar1)) &&
       (iVar1 = (*cb)(">",1,app_key), -1 < iVar1)) {
      (*td->xer_encoder)(&local_48,td,sptr,1,xer_flags,cb,app_key);
      if (local_48.encoded == -1) {
        __return_storage_ptr__->encoded = -1;
LAB_0014cc92:
        *(undefined4 *)&__return_storage_ptr__->failed_type = local_48.failed_type._0_4_;
        *(undefined4 *)((long)&__return_storage_ptr__->failed_type + 4) = local_48.failed_type._4_4_
        ;
        *(undefined4 *)&__return_storage_ptr__->structure_ptr = local_48.structure_ptr._0_4_;
        *(undefined4 *)((long)&__return_storage_ptr__->structure_ptr + 4) =
             local_48.structure_ptr._4_4_;
        return __return_storage_ptr__;
      }
      iVar1 = (*cb)("</",2,app_key);
      if ((-1 < iVar1) && (iVar1 = (*cb)(__s,sVar2,app_key), -1 < iVar1)) {
        uVar3 = (ulong)(((xer_flags & XER_F_CANONICAL) == 0) + 1);
        iVar1 = (*cb)(">\n",uVar3,app_key);
        if (-1 < iVar1) {
          __return_storage_ptr__->encoded = (uVar3 | 4) + sVar2 * 2 + local_48.encoded;
          local_48.failed_type._0_4_ = 0;
          local_48.failed_type._4_4_ = 0;
          local_48.structure_ptr._0_4_ = 0;
          local_48.structure_ptr._4_4_ = 0;
          goto LAB_0014cc92;
        }
      }
    }
  }
  __return_storage_ptr__->encoded = -1;
  __return_storage_ptr__->failed_type = td;
  __return_storage_ptr__->structure_ptr = sptr;
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
xer_encode(asn_TYPE_descriptor_t *td, void *sptr,
	enum xer_encoder_flags_e xer_flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	asn_enc_rval_t er, tmper;
	const char *mname;
	size_t mlen;
	int xcan = (xer_flags & XER_F_CANONICAL) ? 1 : 2;

	if(!td || !sptr) goto cb_failed;

	mname = td->xml_tag;
	mlen = strlen(mname);

	ASN__CALLBACK3("<", 1, mname, mlen, ">", 1);

	tmper = td->xer_encoder(td, sptr, 1, xer_flags, cb, app_key);
	if(tmper.encoded == -1) return tmper;

	ASN__CALLBACK3("</", 2, mname, mlen, ">\n", xcan);

	er.encoded = 4 + xcan + (2 * mlen) + tmper.encoded;

	ASN__ENCODED_OK(er);
cb_failed:
	ASN__ENCODE_FAILED;
}